

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deferred_guarded.hpp
# Opt level: O1

void __thiscall gmlc::libguarded::void_runner<int>::run_task(void_runner<int> *this,int *obj)

{
  element_type *peVar1;
  undefined8 uVar2;
  unique_lock<std::mutex> local_20;
  
  local_20._M_device = &(this->task).m_mutex;
  local_20._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_20);
  local_20._M_owns = true;
  peVar1 = (this->task).m_obj._M_state.
           super___shared_ptr<std::__future_base::_Task_state_base<void_(int_&)>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    (*(peVar1->super__State_base)._vptr__State_baseV2[4])(peVar1,obj);
    std::unique_lock<std::mutex>::~unique_lock(&local_20);
    return;
  }
  uVar2 = std::__throw_future_error(3);
  std::unique_lock<std::mutex>::~unique_lock(&local_20);
  _Unwind_Resume(uVar2);
}

Assistant:

virtual void run_task(T& obj) { task.lock()->operator()(obj); }